

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O0

void uint256_tests::TestFromHex<uint160>(void)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  bool bVar1;
  lazy_ostream *plVar2;
  long in_FS_OFFSET;
  char c;
  string *__range2;
  uint num_chars;
  iterator __end2;
  iterator __begin2;
  string chars_68;
  string invalid_prefix;
  string invalid_chars;
  optional<uint160> valid_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> valid_input;
  string valid_64char_input;
  char *in_stack_fffffffffffff528;
  lazy_ostream *in_stack_fffffffffffff530;
  char *in_stack_fffffffffffff538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff550;
  char *in_stack_fffffffffffff558;
  unit_test_log_t *line_num;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff560;
  allocator<char> *in_stack_fffffffffffff568;
  unit_test_log_t *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff578;
  size_t in_stack_fffffffffffff580;
  char *in_stack_fffffffffffff588;
  const_string local_920 [2];
  lazy_ostream local_900 [3];
  assertion_result local_8d0 [2];
  const_string local_898 [2];
  lazy_ostream local_878 [3];
  assertion_result local_848 [3];
  undefined1 local_800 [16];
  undefined1 local_7f0 [64];
  const_string local_7b0 [2];
  lazy_ostream local_790 [2];
  assertion_result local_770 [2];
  const_string local_738 [2];
  lazy_ostream local_718 [3];
  assertion_result local_6e8 [2];
  const_string local_6b0 [2];
  lazy_ostream local_690 [2];
  assertion_result local_670 [2];
  char *local_638;
  char *local_630;
  allocator<char> local_621;
  const_string local_620 [2];
  lazy_ostream local_600 [2];
  assertion_result local_5e0 [2];
  const_string local_5a8 [2];
  lazy_ostream local_588 [2];
  assertion_result local_568 [2];
  const_string local_530 [2];
  lazy_ostream local_510 [2];
  assertion_result local_4f0 [2];
  const_string local_4b8 [2];
  lazy_ostream local_498 [3];
  assertion_result local_468 [2];
  const_string local_430 [2];
  lazy_ostream local_410 [3];
  assertion_result local_3e0 [2];
  undefined1 local_3a8 [16];
  undefined1 local_398 [64];
  const_string local_358 [2];
  lazy_ostream local_338 [2];
  assertion_result local_318 [2];
  allocator<char> local_2db [43];
  lazy_ostream local_2b0 [3];
  undefined1 local_278 [472];
  lazy_ostream local_a0 [2];
  undefined1 local_80 [120];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff578,(char *)in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  std::allocator<char>::~allocator(local_2db);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (in_stack_fffffffffffff550,(size_type)in_stack_fffffffffffff548,
             (size_type)in_stack_fffffffffffff540);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff548);
  str._M_str = (char *)in_stack_fffffffffffff548;
  str._M_len = (size_t)in_stack_fffffffffffff540;
  uint160::FromHex(str);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff568,
               (const_string *)in_stack_fffffffffffff560,(size_t)in_stack_fffffffffffff558,
               (const_string *)in_stack_fffffffffffff550);
    boost::test_tools::assertion_result::assertion_result<std::optional<uint160>>
              ((assertion_result *)in_stack_fffffffffffff538,
               (optional<uint160> *)in_stack_fffffffffffff530);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff530,(basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    in_stack_fffffffffffff528 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_318,local_338,local_358,0x105,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff568,
               (const_string *)in_stack_fffffffffffff560,(size_t)in_stack_fffffffffffff558,
               (const_string *)in_stack_fffffffffffff550);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff530,(char (*) [1])in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    std::optional<uint160>::operator->((optional<uint160> *)in_stack_fffffffffffff528);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)in_stack_fffffffffffff530);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff548);
    str_11._M_str = in_stack_fffffffffffff588;
    str_11._M_len = in_stack_fffffffffffff580;
    ToLower_abi_cxx11_(str_11);
    in_stack_fffffffffffff538 = "ToLower(valid_input)";
    in_stack_fffffffffffff530 = local_a0;
    in_stack_fffffffffffff528 = "valid_result->ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_398,local_3a8,0x106,1,2,local_80);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff568,
               (const_string *)in_stack_fffffffffffff560,(size_t)in_stack_fffffffffffff558,
               (const_string *)in_stack_fffffffffffff550);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff548,
               (char *)in_stack_fffffffffffff540);
    str_00._M_str = (char *)in_stack_fffffffffffff548;
    str_00._M_len = (size_t)in_stack_fffffffffffff540;
    uint160::FromHex(str_00);
    std::optional::operator_cast_to_bool((optional<uint160> *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff538,
               SUB81((ulong)in_stack_fffffffffffff530 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff530,(basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    in_stack_fffffffffffff528 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3e0,local_410,local_430,0x10a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff568,
               (const_string *)in_stack_fffffffffffff560,(size_t)in_stack_fffffffffffff558,
               (const_string *)in_stack_fffffffffffff550);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff548,
               (char *)in_stack_fffffffffffff540);
    str_01._M_str = (char *)in_stack_fffffffffffff548;
    str_01._M_len = (size_t)in_stack_fffffffffffff540;
    uint160::FromHex(str_01);
    std::optional::operator_cast_to_bool((optional<uint160> *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff538,
               SUB81((ulong)in_stack_fffffffffffff530 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff530,(basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    in_stack_fffffffffffff528 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_468,local_498,local_4b8,0x10b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff568,
               (const_string *)in_stack_fffffffffffff560,(size_t)in_stack_fffffffffffff558,
               (const_string *)in_stack_fffffffffffff550);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_fffffffffffff550,(size_type)in_stack_fffffffffffff548,
               (size_type)in_stack_fffffffffffff540);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff548);
    str_02._M_str = (char *)in_stack_fffffffffffff548;
    str_02._M_len = (size_t)in_stack_fffffffffffff540;
    uint160::FromHex(str_02);
    std::optional::operator_cast_to_bool((optional<uint160> *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff538,
               SUB81((ulong)in_stack_fffffffffffff530 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff530,(basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    in_stack_fffffffffffff528 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4f0,local_510,local_530,0x10c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff528);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff568,
               (const_string *)in_stack_fffffffffffff560,(size_t)in_stack_fffffffffffff558,
               (const_string *)in_stack_fffffffffffff550);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_fffffffffffff550,(size_type)in_stack_fffffffffffff548,
               (size_type)in_stack_fffffffffffff540);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff548);
    str_03._M_str = (char *)in_stack_fffffffffffff548;
    str_03._M_len = (size_t)in_stack_fffffffffffff540;
    uint160::FromHex(str_03);
    std::optional::operator_cast_to_bool((optional<uint160> *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff538,
               SUB81((ulong)in_stack_fffffffffffff530 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff530,(basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    in_stack_fffffffffffff528 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_568,local_588,local_5a8,0x10d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff528);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff568,
               (const_string *)in_stack_fffffffffffff560,(size_t)in_stack_fffffffffffff558,
               (const_string *)in_stack_fffffffffffff550);
    std::operator+(in_stack_fffffffffffff560,in_stack_fffffffffffff558);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff548);
    str_04._M_str = (char *)in_stack_fffffffffffff548;
    str_04._M_len = (size_t)in_stack_fffffffffffff540;
    uint160::FromHex(str_04);
    std::optional::operator_cast_to_bool((optional<uint160> *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff538,
               SUB81((ulong)in_stack_fffffffffffff530 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff530,(basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    in_stack_fffffffffffff528 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5e0,local_600,local_620,0x10e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff528);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff578,(char *)in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  std::allocator<char>::~allocator(&local_621);
  local_630 = (char *)std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff528);
  local_638 = (char *)std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff538);
  while (bVar1 = __gnu_cxx::
                 operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffff538,
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffff530), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff528);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
                 (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff568,
                 (const_string *)in_stack_fffffffffffff560,(size_t)in_stack_fffffffffffff558,
                 (const_string *)in_stack_fffffffffffff550);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffff550,(size_type)in_stack_fffffffffffff548,
                 (size_type)in_stack_fffffffffffff540);
      std::operator+(in_stack_fffffffffffff540,(char)((ulong)in_stack_fffffffffffff538 >> 0x38));
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff548);
      str_05._M_str = (char *)in_stack_fffffffffffff548;
      str_05._M_len = (size_t)in_stack_fffffffffffff540;
      uint160::FromHex(str_05);
      std::optional::operator_cast_to_bool((optional<uint160> *)in_stack_fffffffffffff528);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff538,
                 SUB81((ulong)in_stack_fffffffffffff530 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
                 (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
      boost::unit_test::operator<<
                (in_stack_fffffffffffff530,(basic_cstring<const_char> *)in_stack_fffffffffffff528);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
                 (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
      in_stack_fffffffffffff528 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_670,local_690,local_6b0,0x114,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff528);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff528);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff528);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff528);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff528);
  }
  std::operator+((char *)in_stack_fffffffffffff578,in_stack_fffffffffffff570);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff568,
               (const_string *)in_stack_fffffffffffff560,(size_t)in_stack_fffffffffffff558,
               (const_string *)in_stack_fffffffffffff550);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff538,
               (char *)in_stack_fffffffffffff530,(size_type)in_stack_fffffffffffff528);
    str_06._M_str = (char *)in_stack_fffffffffffff548;
    str_06._M_len = (size_t)in_stack_fffffffffffff540;
    uint160::FromHex(str_06);
    std::optional::operator_cast_to_bool((optional<uint160> *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff538,
               SUB81((ulong)in_stack_fffffffffffff530 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff530,(basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    in_stack_fffffffffffff528 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6e8,local_718,local_738,0x118,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff568,
               (const_string *)in_stack_fffffffffffff560,(size_t)in_stack_fffffffffffff558,
               (const_string *)in_stack_fffffffffffff550);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff548);
    str_07._M_str = (char *)in_stack_fffffffffffff548;
    str_07._M_len = (size_t)in_stack_fffffffffffff540;
    uint160::FromHex(str_07);
    std::optional::operator_cast_to_bool((optional<uint160> *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff538,
               SUB81((ulong)in_stack_fffffffffffff530 >> 0x38,0));
    plVar2 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff530,(basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    in_stack_fffffffffffff528 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_770,local_790,local_7b0,0x119,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff528);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff528);
  std::operator+(in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff568,
               (const_string *)in_stack_fffffffffffff560,(size_t)in_stack_fffffffffffff558,
               (const_string *)in_stack_fffffffffffff550);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff530,(char (*) [1])in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff538,
               (char *)in_stack_fffffffffffff530,(size_type)in_stack_fffffffffffff528);
    str_08._M_str = (char *)in_stack_fffffffffffff548;
    str_08._M_len = (size_t)in_stack_fffffffffffff540;
    uint160::FromHex(str_08);
    std::optional<uint160>::value((optional<uint160> *)in_stack_fffffffffffff538);
    base_blob<160u>::ToString_abi_cxx11_((base_blob<160U> *)in_stack_fffffffffffff530);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff548);
    str_12._M_str = (char *)puVar3;
    str_12._M_len = (size_t)plVar2;
    ToLower_abi_cxx11_(str_12);
    in_stack_fffffffffffff538 = "ToLower(valid_input)";
    in_stack_fffffffffffff530 = local_2b0;
    in_stack_fffffffffffff528 =
         "T::FromHex(std::string_view(chars_68.data(), num_chars)).value().ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_7f0,local_800,0x11e,1,2,local_278);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (puVar3,(const_string *)in_stack_fffffffffffff560,(size_t)in_stack_fffffffffffff558,
               (const_string *)in_stack_fffffffffffff550);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff538,
               (char *)in_stack_fffffffffffff530,(size_type)in_stack_fffffffffffff528);
    str_09._M_str = (char *)in_stack_fffffffffffff548;
    str_09._M_len = (size_t)in_stack_fffffffffffff540;
    uint160::FromHex(str_09);
    std::optional::operator_cast_to_bool((optional<uint160> *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff538,
               SUB81((ulong)in_stack_fffffffffffff530 >> 0x38,0));
    in_stack_fffffffffffff560 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff530,(basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    in_stack_fffffffffffff528 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_848,local_878,local_898,0x11f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (puVar3,(const_string *)in_stack_fffffffffffff560,(size_t)line_num,
               (const_string *)in_stack_fffffffffffff550);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff538,
               (char *)in_stack_fffffffffffff530,(size_type)in_stack_fffffffffffff528);
    str_10._M_str = (char *)in_stack_fffffffffffff548;
    str_10._M_len = (size_t)in_stack_fffffffffffff540;
    uint160::FromHex(str_10);
    std::optional::operator_cast_to_bool((optional<uint160> *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff538,
               SUB81((ulong)in_stack_fffffffffffff530 >> 0x38,0));
    in_stack_fffffffffffff550 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff530,(basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,
               (pointer)in_stack_fffffffffffff530,(unsigned_long)in_stack_fffffffffffff528);
    in_stack_fffffffffffff528 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8d0,local_900,local_920,0x120,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff528);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff528);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff528);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff528);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TestFromHex()
{
    constexpr unsigned int num_chars{T::size() * 2};
    static_assert(num_chars <= 64); // this test needs to be modified to allow for more than 64 hex chars
    const std::string valid_64char_input{"0123456789abcdef0123456789ABCDEF0123456789abcdef0123456789ABCDEF"};
    const auto valid_input{valid_64char_input.substr(0, num_chars)};
    {
        // check that lower and upper case hex characters are accepted
        auto valid_result{T::FromHex(valid_input)};
        BOOST_REQUIRE(valid_result);
        BOOST_CHECK_EQUAL(valid_result->ToString(), ToLower(valid_input));
    }
    {
        // check that only strings of size num_chars are accepted
        BOOST_CHECK(!T::FromHex(""));
        BOOST_CHECK(!T::FromHex("0"));
        BOOST_CHECK(!T::FromHex(valid_input.substr(0, num_chars / 2)));
        BOOST_CHECK(!T::FromHex(valid_input.substr(0, num_chars - 1)));
        BOOST_CHECK(!T::FromHex(valid_input + "0"));
    }
    {
        // check that non-hex characters are not accepted
        std::string invalid_chars{R"( !"#$%&'()*+,-./:;<=>?@GHIJKLMNOPQRSTUVWXYZ[\]^_`ghijklmnopqrstuvwxyz{|}~)"};
        for (auto c : invalid_chars) {
            BOOST_CHECK(!T::FromHex(valid_input.substr(0, num_chars - 1) + c));
        }
        // 0x prefixes are invalid
        std::string invalid_prefix{"0x" + valid_input};
        BOOST_CHECK(!T::FromHex(std::string_view(invalid_prefix.data(), num_chars)));
        BOOST_CHECK(!T::FromHex(invalid_prefix));
    }
    {
        // check that string_view length is respected
        std::string chars_68{valid_64char_input + "0123"};
        BOOST_CHECK_EQUAL(T::FromHex(std::string_view(chars_68.data(), num_chars)).value().ToString(), ToLower(valid_input));
        BOOST_CHECK(!T::FromHex(std::string_view(chars_68.data(), num_chars - 1))); // too short
        BOOST_CHECK(!T::FromHex(std::string_view(chars_68.data(), num_chars + 1))); // too long
    }
}